

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Input.cxx
# Opt level: O0

void Fl_Value_Input::input_cb(Fl_Widget *param_1,void *v)

{
  Fl_When FVar1;
  char *pcVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double local_28;
  double nv;
  Fl_Value_Input *t;
  void *v_local;
  Fl_Widget *param_0_local;
  
  dVar4 = Fl_Valuator::step((Fl_Valuator *)v);
  dVar5 = Fl_Valuator::step((Fl_Valuator *)v);
  dVar5 = floor(dVar5);
  if (dVar4 - dVar5 <= 0.0) {
    dVar4 = Fl_Valuator::step((Fl_Valuator *)v);
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      pcVar2 = Fl_Input_::value((Fl_Input_ *)((long)v + 0xa8));
      lVar3 = strtol(pcVar2,(char **)0x0,0);
      local_28 = (double)lVar3;
      goto LAB_00232da8;
    }
  }
  pcVar2 = Fl_Input_::value((Fl_Input_ *)((long)v + 0xa8));
  local_28 = strtod(pcVar2,(char **)0x0);
LAB_00232da8:
  dVar4 = Fl_Valuator::value((Fl_Valuator *)v);
  if (((local_28 != dVar4) || (NAN(local_28) || NAN(dVar4))) ||
     (FVar1 = Fl_Widget::when((Fl_Widget *)v), (FVar1 & FL_WHEN_NOT_CHANGED) != FL_WHEN_NEVER)) {
    Fl_Valuator::set_value((Fl_Valuator *)v,local_28);
    Fl_Widget::set_changed((Fl_Widget *)v);
    FVar1 = Fl_Widget::when((Fl_Widget *)v);
    if (FVar1 != FL_WHEN_NEVER) {
      Fl_Widget::do_callback((Fl_Widget *)v);
    }
  }
  return;
}

Assistant:

void Fl_Value_Input::input_cb(Fl_Widget*, void* v) {
  Fl_Value_Input& t = *(Fl_Value_Input*)v;
  double nv;
  if ((t.step() - floor(t.step()))>0.0 || t.step() == 0.0) nv = strtod(t.input.value(), 0);
  else nv = strtol(t.input.value(), 0, 0);
  if (nv != t.value() || t.when() & FL_WHEN_NOT_CHANGED) {
    t.set_value(nv);
    t.set_changed();
    if (t.when()) t.do_callback();
  }
}